

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorImpl<llvm::SMFixIt>::append<llvm::SMFixIt_const*,void>
          (SmallVectorImpl<llvm::SMFixIt> *this,SMFixIt *in_start,SMFixIt *in_end)

{
  undefined4 *puVar1;
  long lVar2;
  string *psVar3;
  uint uVar4;
  void *pvVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar12 = ((long)in_end - (long)in_start >> 4) * -0x5555555555555555;
  uVar11 = (ulong)(this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
                  super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  uVar9 = (this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
          super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Capacity -
          uVar11;
  if (uVar9 <= uVar12 && uVar12 - uVar9 != 0) {
    SmallVectorTemplateBase<llvm::SMFixIt,_false>::grow
              (&this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>,uVar11 + uVar12);
  }
  if (in_start != in_end) {
    uVar4 = (this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
            super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
    pvVar5 = (this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
             super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
    lVar10 = 0;
    do {
      puVar1 = (undefined4 *)((long)&(in_start->Range).Start.Ptr + lVar10);
      uVar6 = puVar1[1];
      uVar7 = puVar1[2];
      uVar8 = puVar1[3];
      lVar2 = (long)pvVar5 + lVar10 + (ulong)uVar4 * 0x30 + 0x20;
      *(undefined4 *)(lVar2 + -0x20) = *puVar1;
      *(undefined4 *)(lVar2 + -0x1c) = uVar6;
      *(undefined4 *)(lVar2 + -0x18) = uVar7;
      *(undefined4 *)(lVar2 + -0x14) = uVar8;
      psVar3 = (string *)((long)pvVar5 + lVar10 + (ulong)uVar4 * 0x30 + 0x10);
      *(long *)psVar3 = lVar2;
      std::__cxx11::string::_M_construct<char*>
                (psVar3,*(long *)(puVar1 + 4),*(long *)(puVar1 + 6) + *(long *)(puVar1 + 4));
      lVar10 = lVar10 + 0x30;
    } while ((SMFixIt *)(puVar1 + 0xc) != in_end);
  }
  uVar12 = uVar12 + (this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
                    super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  if (uVar12 <= (this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
                super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Capacity)
  {
    (this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
    super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size = (uint)uVar12;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }